

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O2

uint32_t ivk::cmd_add64(void *el)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  iterator iVar6;
  uint32_t uVar7;
  allocator local_49;
  key_type local_48;
  
  if (el == (void *)0x0) {
    uVar7 = 2;
  }
  else {
    pcVar3 = get_attr_val((XMLElement **)el,"va");
    pcVar4 = get_attr_val((XMLElement **)el,"vb");
    pcVar5 = get_attr_val((XMLElement **)el,"vo");
    if (pcVar5 == (char *)0x0 || (pcVar4 == (char *)0x0 || pcVar3 == (char *)0x0)) {
      uVar7 = 5;
    }
    else {
      std::__cxx11::string::string((string *)&local_48,pcVar3,&local_49);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                      *)gCmdMemMap_abi_cxx11_,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      uVar7 = 7;
      if (iVar6._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
        lVar1 = *(long *)iVar6._M_node[2]._M_parent;
        std::__cxx11::string::string((string *)&local_48,pcVar4,&local_49);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                        *)gCmdMemMap_abi_cxx11_,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        if (iVar6._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
          lVar2 = *(long *)iVar6._M_node[2]._M_parent;
          std::__cxx11::string::string((string *)&local_48,pcVar5,&local_49);
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                          *)gCmdMemMap_abi_cxx11_,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          if (iVar6._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
            *(long *)iVar6._M_node[2]._M_parent = lVar2 + lVar1;
            uVar7 = 0;
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

uint32_t ivk::cmd_add64(void *el) {
    if(!el){
        return proc_param_err;
    }
    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;

    const char* va = get_attr_val(ppEl,"va");
    const char* vb = get_attr_val(ppEl,"vb");
    const char* vo = get_attr_val(ppEl,"vo");
    if(!va || !vb || !vo){
        return proc_xml_err;
    }
    // get mem
    map<string,proc_data>::iterator it = gCmdMemMap.find(va);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    int64_t a = *(int64_t*)it->second.data;

    it = gCmdMemMap.find(vb);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    int64_t b = *(int64_t*)it->second.data;

    it = gCmdMemMap.find(vo);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    *(int64_t*)it->second.data = a+b;

    return proc_success;
}